

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O2

uint vochsh(uchar *t,int len)

{
  byte bVar1;
  uint uVar2;
  ushort **ppuVar3;
  __int32_t **pp_Var4;
  uint uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  iVar7 = 6;
  if (len < 6) {
    iVar7 = len;
  }
  lVar8 = 0;
  uVar5 = 0;
  do {
    if (iVar7 == (int)lVar8) {
      return uVar5;
    }
    bVar1 = t[lVar8];
    lVar6 = (long)(char)bVar1;
    if (lVar6 < 0) {
LAB_001340be:
      uVar2 = (uint)bVar1;
    }
    else {
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar3 + lVar6 * 2 + 1) & 1) == 0) goto LAB_001340be;
      pp_Var4 = __ctype_tolower_loc();
      uVar2 = (*pp_Var4)[lVar6];
    }
    uVar5 = uVar2 + uVar5 & 0xff;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

uint vochsh(uchar *t, int len)
{
    uint ret = 0;
    
    if (len > 6) len = 6;
    for ( ; len ; --len, ++t)
        ret = (ret + (uint)(vocisupper(*t) ? tolower(*t) : *t))
               & (VOCHASHSIZ - 1);
    return(ret);
}